

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpack.cpp
# Opt level: O2

optional<QUrl> __thiscall HPack::makePromiseKeyUrl(HPack *this,HttpHeader *requestHeader)

{
  HeaderField *pHVar1;
  longlong lVar2;
  char *pcVar3;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  char cVar4;
  int iVar5;
  long lVar6;
  QByteArrayView *pQVar7;
  reference pvVar8;
  qsizetype qVar9;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  size_type __n;
  QByteArray *__u;
  long in_FS_OFFSET;
  optional<QUrl> oVar10;
  QArrayDataPointer<char16_t> local_f8;
  QUrl url;
  _Storage<QByteArrayView,_true> local_d8;
  undefined8 local_c8;
  _Storage<QByteArrayView,_true> _Stack_c0;
  undefined8 uStack_b0;
  _Storage<QByteArrayView,_true> local_a8;
  undefined8 local_98;
  _Storage<QByteArrayView,_true> _Stack_90;
  undefined8 uStack_80;
  QByteArrayView names [4];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  names[0].m_size = 10;
  names[0].m_data = ":authority";
  names[1].m_size = 7;
  names[1].m_data = ":method";
  names[2].m_size = 5;
  names[2].m_data = ":path";
  names[3].m_size = 7;
  names[3].m_data = ":scheme";
  _Stack_90._M_value.m_data = (storage_type *)0x0;
  uStack_80 = 0;
  local_98 = 0;
  _Stack_90._M_value.m_size = 0;
  local_a8._M_value.m_size = 0;
  local_a8._M_value.m_data = (storage_type *)0x0;
  _Stack_c0._M_value.m_data = (storage_type *)0x0;
  uStack_b0 = 0;
  local_c8 = 0;
  _Stack_c0._M_value.m_size = 0;
  local_d8._M_value.m_size = 0;
  local_d8._M_value.m_data = (storage_type *)0x0;
  lVar6 = 0x10;
  do {
    *(undefined1 *)((long)&local_d8 + lVar6) = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x70);
  pHVar1 = (requestHeader->
           super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (__u = &((requestHeader->
               super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>)._M_impl.
               super__Vector_impl_data._M_start)->value; (HeaderField *)(__u + -1) != pHVar1;
      __u = __u + 2) {
    local_f8.ptr = (char16_t *)(((HeaderField *)(__u + -1))->name).d.ptr;
    local_f8.d = (Data *)(((HeaderField *)(__u + -1))->name).d.size;
    pQVar7 = std::
             __find_if<QByteArrayView_const*,__gnu_cxx::__ops::_Iter_equals_val<QByteArrayView_const>>
                       (names,(QByteArrayView *)&local_38,&local_f8);
    in_RDX = extraout_RDX;
    if (pQVar7 != (QByteArrayView *)&local_38) {
      if ((__u->d).size == 0) goto LAB_001cb536;
      __n = (long)pQVar7 - (long)names >> 4;
      pvVar8 = std::array<std::optional<QByteArrayView>,_4UL>::at
                         ((array<std::optional<QByteArrayView>,_4UL> *)&local_d8._M_value,__n);
      in_RDX = extraout_RDX_00;
      if ((pvVar8->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
          super__Optional_payload_base<QByteArrayView>._M_engaged == true) goto LAB_001cb536;
      pvVar8 = std::array<std::optional<QByteArrayView>,_4UL>::operator[]
                         ((array<std::optional<QByteArrayView>,_4UL> *)&local_d8._M_value,__n);
      std::optional<QByteArrayView>::operator=(pvVar8,__u);
      in_RDX = extraout_RDX_01;
    }
  }
  if (((((char)local_c8 == '\x01') && ((char)uStack_b0 == '\x01')) && ((char)local_98 == '\x01')) &&
     ((char)uStack_80 != '\0')) {
    pQVar7 = std::optional<QByteArrayView>::value((optional<QByteArrayView> *)&_Stack_c0._M_value);
    lVar2 = pQVar7->m_size;
    pcVar3 = pQVar7->m_data;
    qVar9 = QByteArrayView::lengthHelperCharArray("get",4);
    iVar5 = qstrnicmp(pcVar3,lVar2,"get",qVar9);
    if (iVar5 != 0) {
      qVar9 = QByteArrayView::lengthHelperCharArray("head",5);
      iVar5 = qstrnicmp(pcVar3,lVar2,"head",qVar9);
      in_RDX = extraout_RDX_02;
      if (iVar5 != 0) goto LAB_001cb536;
    }
    url.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::QUrl(&url);
    pQVar7 = std::optional<QByteArrayView>::value((optional<QByteArrayView> *)&_Stack_90._M_value);
    latin1.m_size = pQVar7->m_size;
    latin1.m_data = pQVar7->m_data;
    QString::QString((QString *)&local_f8,latin1);
    QUrl::setScheme((QString *)&url);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    pQVar7 = std::optional<QByteArrayView>::value((optional<QByteArrayView> *)&local_d8._M_value);
    latin1_00.m_size = pQVar7->m_size;
    latin1_00.m_data = pQVar7->m_data;
    QString::QString((QString *)&local_f8,latin1_00);
    QUrl::setAuthority((QString *)&url,(ParsingMode)&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    pQVar7 = std::optional<QByteArrayView>::value((optional<QByteArrayView> *)&local_a8._M_value);
    latin1_01.m_size = pQVar7->m_size;
    latin1_01.m_data = pQVar7->m_data;
    QString::QString((QString *)&local_f8,latin1_01);
    QUrl::setPath((QString *)&url,(ParsingMode)&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    cVar4 = QUrl::isValid();
    if (cVar4 != '\0') {
      *(QUrlPrivate **)this = url.d;
      url.d = (QUrlPrivate *)0x0;
    }
    this[8] = (HPack)(cVar4 != '\0');
    QUrl::~QUrl(&url);
    in_RDX = extraout_RDX_03;
  }
  else {
LAB_001cb536:
    this[8] = (HPack)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    oVar10.super__Optional_base<QUrl,_false,_false>._M_payload.
    super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>._8_8_ =
         in_RDX;
    oVar10.super__Optional_base<QUrl,_false,_false>._M_payload.
    super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>._M_payload
         = (_Storage<QUrl,_false>)this;
    return (optional<QUrl>)
           oVar10.super__Optional_base<QUrl,_false,_false>._M_payload.
           super__Optional_payload<QUrl,_true,_false,_false>.super__Optional_payload_base<QUrl>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<QUrl> makePromiseKeyUrl(const HttpHeader &requestHeader)
{
    constexpr QByteArrayView names[] = { ":authority", ":method", ":path", ":scheme" };
    enum PseudoHeaderEnum
    {
        Authority,
        Method,
        Path,
        Scheme
    };
    std::array<std::optional<QByteArrayView>, std::size(names)> pseudoHeaders{};
    for (const auto &field : requestHeader) {
        const auto *it = std::find(std::begin(names), std::end(names), QByteArrayView(field.name));
        if (it != std::end(names)) {
            const auto index = std::distance(std::begin(names), it);
            if (field.value.isEmpty() || pseudoHeaders.at(index).has_value())
                return {};
            pseudoHeaders[index] = field.value;
        }
    }

    auto optionalIsSet = [](const auto &x) { return x.has_value(); };
    if (!std::all_of(pseudoHeaders.begin(), pseudoHeaders.end(), optionalIsSet)) {
        // All four required, HTTP/2 8.1.2.3.
        return {};
    }

    const QByteArrayView method = pseudoHeaders[Method].value();
    if (method.compare("get", Qt::CaseInsensitive) != 0 &&
        method.compare("head", Qt::CaseInsensitive) != 0) {
        return {};
    }

    QUrl url;
    url.setScheme(QLatin1StringView(pseudoHeaders[Scheme].value()));
    url.setAuthority(QLatin1StringView(pseudoHeaders[Authority].value()));
    url.setPath(QLatin1StringView(pseudoHeaders[Path].value()));

    if (!url.isValid())
        return {};
    return url;
}